

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  SystemVerilogCodeGenOptions *in_RCX;
  undefined1 local_70 [8];
  string local_68 [32];
  uint64_t local_48;
  string local_40 [32];
  bool local_20;
  kratos *local_18;
  Generator *top_local;
  
  local_70[0] = true;
  local_70[1] = false;
  local_18 = this;
  top_local = (Generator *)__return_storage_ptr__;
  std::__cxx11::string::string(local_68);
  local_48 = 0x50;
  std::__cxx11::string::string(local_40);
  local_20 = false;
  generate_verilog_abi_cxx11_(__return_storage_ptr__,this,(Generator *)local_70,in_RCX);
  SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions((SystemVerilogCodeGenOptions *)local_70)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> generate_verilog(Generator* top) {
    return generate_verilog(top, {});
}